

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O2

lzma_ret lzma_filters_copy(lzma_filter *src,lzma_filter *dest,lzma_allocator *allocator)

{
  lzma_filter *plVar1;
  size_t size;
  long lVar2;
  void *__dest;
  lzma_ret lVar3;
  long lVar4;
  ulong uVar5;
  
  if (dest == (lzma_filter *)0x0 || src == (lzma_filter *)0x0) {
    lVar3 = LZMA_PROG_ERROR;
  }
  else {
    lVar4 = 0;
    uVar5 = 0;
    while( true ) {
      lVar2 = 8;
      if (src[uVar5].id == 0xffffffffffffffff) {
        if (uVar5 < 6) {
          dest[uVar5].id = 0xffffffffffffffff;
          dest[uVar5].options = (void *)0x0;
          return LZMA_OK;
        }
        __assert_fail("i <= LZMA_FILTERS_MAX + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/filter_common.c"
                      ,0xb1,
                      "lzma_ret lzma_filters_copy(const lzma_filter *, lzma_filter *, lzma_allocator *)"
                     );
      }
      if (uVar5 == 4) break;
      plVar1 = src + uVar5;
      dest[uVar5].id = src[uVar5].id;
      if (plVar1->options == (void *)0x0) {
        dest[uVar5].options = (void *)0x0;
      }
      else {
        while (plVar1->id !=
               *(lzma_vli *)
                (
                "lzma_ret block_encode(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                + lVar2 + 0x9b)) {
          lVar2 = lVar2 + 0x18;
          if (lVar2 == 0xf8) goto LAB_0019c92f;
        }
        size = *(size_t *)((long)&features[0].id + lVar2);
        __dest = lzma_alloc(size,allocator);
        dest[uVar5].options = __dest;
        if (__dest == (void *)0x0) {
          lVar3 = LZMA_MEM_ERROR;
          goto LAB_0019c965;
        }
        memcpy(__dest,plVar1->options,size);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    }
LAB_0019c92f:
    lVar3 = LZMA_OPTIONS_ERROR;
LAB_0019c965:
    for (; lVar4 != 0; lVar4 = lVar4 + -0x10) {
      lzma_free(*(void **)((long)dest + lVar4 + -8),allocator);
      *(undefined8 *)((long)dest + lVar4 + -8) = 0;
    }
  }
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filters_copy(const lzma_filter *src, lzma_filter *dest,
		lzma_allocator *allocator)
{
	size_t i;
	lzma_ret ret;

	if (src == NULL || dest == NULL)
		return LZMA_PROG_ERROR;

	for (i = 0; src[i].id != LZMA_VLI_UNKNOWN; ++i) {
		// There must be a maximum of four filters plus
		// the array terminator.
		if (i == LZMA_FILTERS_MAX) {
			ret = LZMA_OPTIONS_ERROR;
			goto error;
		}

		dest[i].id = src[i].id;

		if (src[i].options == NULL) {
			dest[i].options = NULL;
		} else {
			// See if the filter is supported only when the
			// options is not NULL. This might be convenient
			// sometimes if the app is actually copying only
			// a partial filter chain with a place holder ID.
			//
			// When options is not NULL, the Filter ID must be
			// supported by us, because otherwise we don't know
			// how big the options are.
			size_t j;
			for (j = 0; src[i].id != features[j].id; ++j) {
				if (features[j].id == LZMA_VLI_UNKNOWN) {
					ret = LZMA_OPTIONS_ERROR;
					goto error;
				}
			}

			// Allocate and copy the options.
			dest[i].options = lzma_alloc(features[j].options_size,
					allocator);
			if (dest[i].options == NULL) {
				ret = LZMA_MEM_ERROR;
				goto error;
			}

			memcpy(dest[i].options, src[i].options,
					features[j].options_size);
		}
	}

	// Terminate the filter array.
	assert(i <= LZMA_FILTERS_MAX + 1);
	dest[i].id = LZMA_VLI_UNKNOWN;
	dest[i].options = NULL;

	return LZMA_OK;

error:
	// Free the options which we have already allocated.
	while (i-- > 0) {
		lzma_free(dest[i].options, allocator);
		dest[i].options = NULL;
	}

	return ret;
}